

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

BasicResult<Catch::Clara::Detail::ParseState> *
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::
ok<Catch::Clara::Detail::ParseState>
          (BasicResult<Catch::Clara::Detail::ParseState> *__return_storage_ptr__,ParseState *value)

{
  ResultValueBase(__return_storage_ptr__,Ok,value);
  return __return_storage_ptr__;
}

Assistant:

static auto ok( U const& value ) -> BasicResult {
                    return { ResultType::Ok, value };
                }